

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,float,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  value_type vVar2;
  const_reference pvVar3;
  ulong uVar4;
  idx_t iVar5;
  SelectionVector *pSVar6;
  ulong uVar7;
  ulong uVar8;
  value_type rhs_offset_in_row;
  idx_t entry_idx;
  bool bVar9;
  uchar **rhs_locations;
  SelectionVector *lhs_sel;
  idx_t local_68;
  float local_58;
  float local_54;
  data_ptr_t local_50;
  ulong local_48;
  data_ptr_t local_40;
  SelectionVector *local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_38 = (lhs_format->unified).sel;
  local_50 = (lhs_format->unified).data;
  local_40 = rhs_row_locations->data;
  pvVar3 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar2 = *pvVar3;
  local_48 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_68 = 0;
      uVar8 = 0;
      do {
        uVar7 = uVar8;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)sel->sel_vector[uVar8];
        }
        uVar4 = uVar7;
        if (local_38->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_38->sel_vector[uVar7];
        }
        local_58 = *(float *)(*(long *)(local_40 + uVar7 * 8) + vVar2);
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(local_40 + uVar7 * 8) + (col_idx >> 3))) == 0) ||
           (bVar9 = GreaterThan::Operation<float>(&local_58,(float *)(local_50 + uVar4 * 4)),
           count = local_48, !bVar9)) {
          iVar5 = *no_match_count;
          *no_match_count = iVar5 + 1;
          pSVar6 = no_match_sel;
        }
        else {
          iVar5 = local_68;
          pSVar6 = sel;
          local_68 = local_68 + 1;
        }
        pSVar6->sel_vector[iVar5] = (sel_t)uVar7;
        uVar8 = uVar8 + 1;
      } while (count != uVar8);
      return local_68;
    }
  }
  else if (count != 0) {
    local_68 = 0;
    uVar8 = 0;
    do {
      uVar7 = uVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)sel->sel_vector[uVar8];
      }
      uVar4 = uVar7;
      if (local_38->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)local_38->sel_vector[uVar7];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = (puVar1[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
      }
      local_54 = *(float *)(*(long *)(local_40 + uVar7 * 8) + vVar2);
      if (((bVar9) ||
          (((uint)*(byte *)(*(long *)(local_40 + uVar7 * 8) + (col_idx >> 3)) &
           1 << ((byte)col_idx & 7)) == 0)) ||
         (bVar9 = GreaterThan::Operation<float>(&local_54,(float *)(local_50 + uVar4 * 4)),
         count = local_48, !bVar9)) {
        iVar5 = *no_match_count;
        *no_match_count = iVar5 + 1;
        pSVar6 = no_match_sel;
      }
      else {
        iVar5 = local_68;
        pSVar6 = sel;
        local_68 = local_68 + 1;
      }
      pSVar6->sel_vector[iVar5] = (sel_t)uVar7;
      uVar8 = uVar8 + 1;
    } while (count != uVar8);
    return local_68;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}